

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O2

int __thiscall
ncnn::MultiHeadAttention::forward
          (MultiHeadAttention *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  int iVar1;
  pointer pMVar2;
  Mat *this_00;
  size_t sVar3;
  void *pvVar4;
  void *pvVar5;
  int *piVar6;
  void *pvVar7;
  int j_1;
  ulong uVar8;
  long lVar9;
  void *pvVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  int j_2;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  void *pvVar23;
  int j;
  long lVar24;
  long lVar25;
  long lVar26;
  int j_4;
  int iVar27;
  void *pvVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  bool bVar33;
  float sum;
  float fVar34;
  float fVar35;
  float fVar36;
  void *local_278;
  long local_270;
  void *local_268;
  void *local_260;
  void *local_258;
  Mat local_1b8;
  Mat local_168;
  Mat local_118;
  Mat local_c8;
  Mat local_78;
  
  pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar33 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar2 == 0x48;
  lVar18 = 0x48;
  if (bVar33) {
    lVar18 = 0;
  }
  lVar31 = 0x90;
  if (bVar33) {
    lVar31 = 0;
  }
  _h = pMVar2->h;
  uVar32 = (ulong)_h;
  uVar8 = (long)this->embed_dim / (long)this->num_head;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->embed_dim,_h,4,opt->blob_allocator);
  iVar19 = -1;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    iVar19 = (int)uVar8;
    Mat::create(&local_78,iVar19,_h,this->num_head,4,opt->workspace_allocator);
    local_c8.cstep = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize._0_4_ = 0;
    local_c8.elemsize._4_4_ = 0;
    local_c8.elempack = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    Mat::create(&local_c8,iVar19,_h,this->num_head,4,opt->workspace_allocator);
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    Mat::create(&local_118,_h,iVar19,this->num_head,4,opt->workspace_allocator);
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168.elemsize._4_4_ = 0;
    local_168.elempack = 0;
    local_168.allocator = (Allocator *)0x0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    Mat::create(&local_168,_h,_h,this->num_head,4,opt->workspace_allocator);
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.allocator = (Allocator *)0x0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    Mat::create(&local_1b8,iVar19,this->num_head,_h,4,opt->workspace_allocator);
    pvVar7 = local_78.data;
    pvVar5 = local_c8.data;
    pvVar23 = local_118.data;
    pvVar4 = local_168.data;
    lVar22 = local_78.cstep * CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
    lVar11 = (long)local_78.w * CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
    lVar24 = local_c8.cstep * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
    lVar12 = (long)local_c8.w * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
    lVar25 = local_118.cstep * CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
    lVar13 = (long)local_118.w * CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
    lVar26 = local_168.cstep * CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
    lVar14 = (long)local_168.w * CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
    uVar17 = 0;
    if (0 < iVar19) {
      uVar17 = uVar8 & 0xffffffff;
    }
    uVar8 = 0;
    if (0 < (int)_h) {
      uVar8 = (ulong)_h;
    }
    local_270 = 0;
    uVar30 = (ulong)(uint)this->num_head;
    if (this->num_head < 1) {
      uVar30 = 0;
    }
    local_258 = local_118.data;
    local_278 = local_168.data;
    local_260 = local_c8.data;
    local_268 = local_78.data;
    for (uVar16 = 0; uVar16 != uVar30; uVar16 = uVar16 + 1) {
      lVar9 = uVar16 * (long)iVar19;
      for (uVar15 = 0; uVar15 != uVar8; uVar15 = uVar15 + 1) {
        iVar1 = this->embed_dim;
        pvVar10 = (this->q_bias_data).data;
        iVar27 = 0;
        if (0 < iVar1) {
          iVar27 = iVar1;
        }
        pvVar28 = (void *)(local_270 * iVar1 + (long)(this->q_weight_data).data);
        for (uVar29 = 0; uVar29 != uVar17; uVar29 = uVar29 + 1) {
          fVar34 = *(float *)((long)pvVar10 + (uVar29 + lVar9) * 4);
          for (lVar20 = 0; iVar27 != (int)lVar20; lVar20 = lVar20 + 1) {
            fVar34 = fVar34 + *(float *)((long)pvVar28 + lVar20 * 4) *
                              *(float *)((long)pMVar2->data +
                                        lVar20 * 4 + pMVar2->elemsize * uVar15 * (long)pMVar2->w);
          }
          *(float *)((long)pvVar7 + uVar29 * 4 + lVar11 * uVar15 + lVar22 * uVar16) =
               fVar34 * (1.0 / SQRT((float)iVar19));
          pvVar28 = (void *)((long)pvVar28 + (long)iVar1 * 4);
        }
      }
      for (uVar15 = 0; uVar15 != uVar8; uVar15 = uVar15 + 1) {
        iVar1 = this->embed_dim;
        pvVar10 = (this->k_bias_data).data;
        iVar27 = 0;
        if (0 < iVar1) {
          iVar27 = iVar1;
        }
        pvVar28 = (void *)(local_270 * iVar1 + (long)(this->k_weight_data).data);
        for (uVar29 = 0; uVar29 != uVar17; uVar29 = uVar29 + 1) {
          fVar34 = *(float *)((long)pvVar10 + (uVar29 + lVar9) * 4);
          for (lVar20 = 0; iVar27 != (int)lVar20; lVar20 = lVar20 + 1) {
            fVar34 = fVar34 + *(float *)((long)pvVar28 + lVar20 * 4) *
                              *(float *)(*(long *)((long)&pMVar2->elemsize + lVar18) * uVar15 *
                                         (long)*(int *)((long)&pMVar2->w + lVar18) +
                                         *(long *)((long)&pMVar2->data + lVar18) + lVar20 * 4);
          }
          *(float *)((long)pvVar5 + uVar29 * 4 + lVar12 * uVar15 + lVar24 * uVar16) = fVar34;
          pvVar28 = (void *)((long)pvVar28 + (long)iVar1 * 4);
        }
      }
      lVar20 = local_270;
      for (uVar15 = 0; uVar15 != uVar17; uVar15 = uVar15 + 1) {
        iVar1 = this->embed_dim;
        pvVar10 = (this->v_bias_data).data;
        iVar27 = 0;
        if (0 < iVar1) {
          iVar27 = iVar1;
        }
        pvVar28 = (this->v_weight_data).data;
        for (uVar29 = 0; uVar29 != uVar8; uVar29 = uVar29 + 1) {
          fVar34 = *(float *)((long)pvVar10 + (uVar15 + lVar9) * 4);
          for (lVar21 = 0; iVar27 != (int)lVar21; lVar21 = lVar21 + 1) {
            fVar34 = fVar34 + *(float *)((long)pvVar28 + lVar21 * 4 + iVar1 * lVar20) *
                              *(float *)(*(long *)((long)&pMVar2->elemsize + lVar31) * uVar29 *
                                         (long)*(int *)((long)&pMVar2->w + lVar31) +
                                         *(long *)((long)&pMVar2->data + lVar31) + lVar21 * 4);
          }
          *(float *)((long)pvVar23 + uVar29 * 4 + lVar13 * uVar15 + lVar25 * uVar16) = fVar34;
        }
        lVar20 = lVar20 + 4;
      }
      pvVar10 = local_268;
      for (uVar15 = 0; uVar15 != uVar8; uVar15 = uVar15 + 1) {
        pvVar28 = local_260;
        for (uVar29 = 0; uVar29 != uVar32; uVar29 = uVar29 + 1) {
          fVar34 = 0.0;
          for (lVar9 = 0; (int)uVar17 != (int)lVar9; lVar9 = lVar9 + 1) {
            fVar34 = fVar34 + *(float *)((long)pvVar28 + lVar9 * 4) *
                              *(float *)((long)pvVar10 + lVar9 * 4);
          }
          *(float *)((long)pvVar4 + uVar29 * 4 + lVar14 * uVar15 + lVar26 * uVar16) = fVar34;
          pvVar28 = (void *)((long)pvVar28 + lVar12);
        }
        pvVar10 = (void *)((long)pvVar10 + lVar11);
      }
      pvVar10 = local_278;
      for (uVar15 = 0; uVar15 != uVar8; uVar15 = uVar15 + 1) {
        fVar34 = -3.4028235e+38;
        for (uVar29 = 0; uVar32 != uVar29; uVar29 = uVar29 + 1) {
          fVar36 = *(float *)((long)pvVar10 + uVar29 * 4);
          if (fVar34 <= fVar36) {
            fVar34 = fVar36;
          }
        }
        fVar36 = 0.0;
        for (uVar29 = 0; uVar32 != uVar29; uVar29 = uVar29 + 1) {
          fVar35 = expf(*(float *)((long)pvVar10 + uVar29 * 4) - fVar34);
          *(float *)((long)pvVar10 + uVar29 * 4) = fVar35;
          fVar36 = fVar36 + fVar35;
        }
        for (uVar29 = 0; uVar32 != uVar29; uVar29 = uVar29 + 1) {
          *(float *)((long)pvVar10 + uVar29 * 4) =
               *(float *)((long)pvVar10 + uVar29 * 4) * (1.0 / fVar36);
        }
        pvVar10 = (void *)((long)pvVar10 + lVar14);
      }
      pvVar10 = local_278;
      for (uVar15 = 0; uVar15 != uVar8; uVar15 = uVar15 + 1) {
        pvVar28 = local_258;
        for (uVar29 = 0; uVar29 != uVar17; uVar29 = uVar29 + 1) {
          fVar34 = 0.0;
          for (lVar9 = 0; _h != (uint)lVar9; lVar9 = lVar9 + 1) {
            fVar34 = fVar34 + *(float *)((long)pvVar28 + lVar9 * 4) *
                              *(float *)((long)pvVar10 + lVar9 * 4);
          }
          *(float *)((long)local_1b8.data +
                    uVar29 * 4 +
                    local_1b8.cstep *
                    CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize) * uVar15 +
                    (long)local_1b8.w * uVar16 *
                    CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize)) = fVar34;
          pvVar28 = (void *)((long)pvVar28 + lVar13);
        }
        pvVar10 = (void *)((long)pvVar10 + lVar14);
      }
      local_270 = local_270 + (long)iVar19 * 4;
      local_268 = (void *)((long)local_268 + lVar22);
      local_260 = (void *)((long)local_260 + lVar24);
      local_278 = (void *)((long)local_278 + lVar26);
      local_258 = (void *)((long)local_258 + lVar25);
    }
    uVar17 = 0;
    uVar32 = (ulong)(uint)this->embed_dim;
    if (this->embed_dim < 1) {
      uVar32 = uVar17;
    }
    for (; uVar17 != uVar8; uVar17 = uVar17 + 1) {
      iVar19 = this_00->w;
      sVar3 = this_00->elemsize;
      pvVar4 = this_00->data;
      pvVar23 = (this->out_weight_data).data;
      iVar1 = this->embed_dim;
      iVar27 = 0;
      if (0 < iVar1) {
        iVar27 = iVar1;
      }
      pvVar5 = (this->out_bias_data).data;
      for (uVar30 = 0; uVar30 != uVar32; uVar30 = uVar30 + 1) {
        fVar34 = *(float *)((long)pvVar5 + uVar30 * 4);
        for (lVar18 = 0; iVar27 != (int)lVar18; lVar18 = lVar18 + 1) {
          fVar34 = fVar34 + *(float *)((long)pvVar23 + lVar18 * 4) *
                            *(float *)((long)local_1b8.data +
                                      lVar18 * 4 +
                                      local_1b8.cstep *
                                      CONCAT44(local_1b8.elemsize._4_4_,
                                               (undefined4)local_1b8.elemsize) * uVar17);
        }
        *(float *)((long)pvVar4 + uVar30 * 4 + (long)iVar19 * uVar17 * sVar3) = fVar34;
        pvVar23 = (void *)((long)pvVar23 + (long)iVar1 * 4);
      }
    }
    piVar6 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          free(local_1b8.data);
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar6 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          free(local_168.data);
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar6 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          free(local_118.data);
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          free(local_c8.data);
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar19 = 0;
  }
  return iVar19;
}

Assistant:

int MultiHeadAttention::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = bottom_blobs.size() == 1 ? q_blob : bottom_blobs[1];
    const Mat& v_blob = bottom_blobs.size() == 1 ? q_blob : bottom_blobs[2];

    const int seqlen = q_blob.h;
    const int embed_dim_per_head = embed_dim / num_head;

    Mat& top_blob = top_blobs[0];
    top_blob.create(embed_dim, seqlen, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -1;

    Mat xq(embed_dim_per_head, seqlen, num_head, 4u, opt.workspace_allocator);
    Mat xk(embed_dim_per_head, seqlen, num_head, 4u, opt.workspace_allocator);
    Mat xv(seqlen, embed_dim_per_head, num_head, 4u, opt.workspace_allocator);

    Mat xqk(seqlen, seqlen, num_head, 4u, opt.workspace_allocator);

    Mat xqkv(embed_dim_per_head, num_head, seqlen, 4u, opt.workspace_allocator);

    const float inv_sqrt_embed_dim_per_head = 1.f / sqrt(embed_dim_per_head);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_head; q++)
    {
        // xq = affine(q) * inv_sqrt_embed_dim_per_head
        {
            Mat outm = xq.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = q_blob.row(i);
                    const float* kptr = (const float*)q_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = q_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum * inv_sqrt_embed_dim_per_head;
                }
            }
        }

        // xk = affine(k)
        {
            Mat outm = xk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = k_blob.row(i);
                    const float* kptr = (const float*)k_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = k_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xv = affine(v)
        {
            Mat outm = xv.channel(q);

            for (int i = 0; i < embed_dim_per_head; i++)
            {
                for (int j = 0; j < seqlen; j++)
                {
                    const float* ptr = v_blob.row(j);
                    const float* kptr = (const float*)v_weight_data + embed_dim * (q * embed_dim_per_head + i);

                    float sum = v_bias_data[q * embed_dim_per_head + i];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    float* outptr = outm.row(i);

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xq * xk
        // xq  (embed_dim_per_head, seqlen)
        // xk  (embed_dim_per_head, seqlen)
        {
            const Mat xqm = xq.channel(q);
            const Mat xkm = xk.channel(q);

            Mat outm = xqk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < seqlen; j++)
                {
                    const float* qptr = xqm.row(i);
                    const float* kptr = xkm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < embed_dim_per_head; k++)
                    {
                        sum += *qptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // softmax(xqk)
        {
            Mat outm = xqk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* ptr = outm.row(i);

                float max = -FLT_MAX;
                for (int j = 0; j < seqlen; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < seqlen; j++)
                {
                    ptr[j] = (float)(exp(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < seqlen; j++)
                {
                    ptr[j] /= sum;
                }
            }
        }

        // xqkv = xqk * xv
        // xqk (seqlen, seqlen)
        // xv  (seqlen, embed_dim_per_head)
        // out (embed_dim_per_head, num_head, seqlen)
        {
            const Mat xqkm = xqk.channel(q);
            const Mat xvm = xv.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = xqkv.channel(i).row(q);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* qkptr = xqkm.row(i);
                    const float* vptr = xvm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < seqlen; k++)
                    {
                        sum += *qkptr++ * *vptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }
    }

    // out = affine(xqkv)
    // xqkv  (embed_dim, seqlen)
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < seqlen; i++)
    {
        float* outptr = top_blob.row(i);

        for (int j = 0; j < embed_dim; j++)
        {
            const float* ptr = xqkv.channel(i);
            const float* kptr = (const float*)out_weight_data + embed_dim * j;

            float sum = out_bias_data[j];
            for (int k = 0; k < embed_dim; k++)
            {
                sum += *ptr++ * *kptr++;
            }

            outptr[j] = sum;
        }
    }

    return 0;
}